

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::MessageFieldGenerator::PrintNestedBuilderFunction
          (MessageFieldGenerator *this,Printer *printer,char *method_prototype,char *regular_case,
          char *nested_builder_case,char *trailing_code)

{
  io::Printer::Print(printer,&this->variables_,method_prototype);
  io::Printer::Print(printer," {\n");
  io::Printer::Indent(printer);
  PrintNestedBuilderCondition(this,printer,regular_case,nested_builder_case);
  if (trailing_code != (char *)0x0) {
    io::Printer::Print(printer,&this->variables_,trailing_code);
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void MessageFieldGenerator::PrintNestedBuilderFunction(
    io::Printer* printer,
    const char* method_prototype,
    const char* regular_case,
    const char* nested_builder_case,
    const char* trailing_code) const {
  printer->Print(variables_, method_prototype);
  printer->Print(" {\n");
  printer->Indent();
  PrintNestedBuilderCondition(printer, regular_case, nested_builder_case);
  if (trailing_code != NULL) {
    printer->Print(variables_, trailing_code);
  }
  printer->Outdent();
  printer->Print("}\n");
}